

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void mp::
     WriteAlgCon<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::MutAlgebraicCon,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
               (Writer *w,MutAlgebraicCon *con,VarNamer vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  BasicWriter<char> *this;
  BasicStringRef<char> *in_RDI;
  double dVar1;
  double dVar2;
  LinearExpr *in_stack_00000028;
  Writer *in_stack_00000030;
  VarNamer in_stack_00000038;
  ExprBase in_stack_00000040;
  double ub;
  double lb;
  double inf;
  char *in_stack_ffffffffffffff48;
  BasicStringRef<char> *in_stack_ffffffffffffff50;
  BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_ffffffffffffff58;
  double in_stack_ffffffffffffff68;
  BasicStringRef<char> *value_03;
  BasicWriter<char> *in_stack_ffffffffffffff70;
  BasicWriter<char> *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  
  dVar1 = BasicProblem<mp::BasicProblemParams<int>_>::
          BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::lb((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)0x1a3eed);
  dVar2 = BasicProblem<mp::BasicProblemParams<int>_>::
          BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::ub((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)0x1a3f03);
  if ((((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) && ((dVar1 != -INFINITY || (NAN(dVar1)))))
     && ((dVar2 != INFINITY || (NAN(dVar2))))) {
    in_stack_ffffffffffffff78 =
         fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    value.size_ = in_stack_ffffffffffffff80;
    value.data_ = (char *)in_stack_ffffffffffffff78;
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff70,value);
  }
  value_03 = in_RDI;
  this = (BasicWriter<char> *)
         BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::linear_expr
                   ((MutAlgebraicCon *)0x1a3fcf);
  BasicProblem<mp::BasicProblemParams<int>_>::
  BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  ::nonlinear_expr(in_stack_ffffffffffffff58);
  WriteExpr<mp::internal::ExprTypes,mp::LinearExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
            (in_stack_00000030,in_stack_00000028,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_00000040.impl_,
             in_stack_00000038);
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    if ((dVar2 != INFINITY) || (NAN(dVar2))) {
      fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
      ;
      value_01.size_ = in_stack_ffffffffffffff80;
      value_01.data_ = (char *)in_stack_ffffffffffffff78;
      fmt::BasicWriter<char>::operator<<(this,value_01);
      fmt::BasicWriter<char>::operator<<(this,(double)value_03);
    }
    else if ((dVar1 != -INFINITY) || (NAN(dVar1))) {
      fmt::BasicStringRef<char>::BasicStringRef(in_RDI,in_stack_ffffffffffffff48);
      value_02.size_ = in_stack_ffffffffffffff80;
      value_02.data_ = (char *)in_stack_ffffffffffffff78;
      fmt::BasicWriter<char>::operator<<(this,value_02);
      fmt::BasicWriter<char>::operator<<(this,(double)value_03);
    }
  }
  else {
    fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    value_00.size_ = in_stack_ffffffffffffff80;
    value_00.data_ = (char *)in_stack_ffffffffffffff78;
    fmt::BasicWriter<char>::operator<<(this,value_00);
    fmt::BasicWriter<char>::operator<<(this,(double)value_03);
  }
  return;
}

Assistant:

void WriteAlgCon(fmt::Writer &w,
                 const AlgCon &con, VN vnam) {
  double inf = INFINITY;
  double lb = con.lb(), ub = con.ub();
  if (lb != ub && lb != -inf && ub != inf)
    w << lb << " <= ";
  WriteExpr<ExprTypes>(
        w, con.linear_expr(), con.nonlinear_expr(), vnam);
  if (lb == ub)
    w << " = " << lb;
  else if (ub != inf)
    w << " <= " << ub;
  else if (lb != -inf)
    w << " >= " << lb;
}